

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_art_oom.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_1b6d1::
ARTOOMTest_DbInsertNodeRecursion_Test<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::TestBody(ARTOOMTest_DbInsertNodeRecursion_Test<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this)

{
  pointer *this_00;
  bool bVar1;
  value_view v;
  value_view v_00;
  value_view v_01;
  value_view v_02;
  undefined1 local_180 [8];
  tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  verifier;
  Message local_78 [4];
  undefined1 auStack_58 [8];
  TrueWithString gtest_msg;
  
  unodb::test::
  tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::tree_verifier((tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                   *)local_180,false);
  v._M_extent._M_extent_value = 1;
  v._M_ptr = &unodb::test::test_value_1;
  unodb::test::
  tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::insert_internal((tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                     *)local_180,1,v,false);
  v_00._M_extent._M_extent_value = 3;
  v_00._M_ptr = (pointer)&unodb::test::test_value_3;
  unodb::test::
  tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::insert_internal((tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                     *)local_180,3,v_00,false);
  v_01._M_extent._M_extent_value = 4;
  v_01._M_ptr = (pointer)&unodb::test::test_value_4;
  unodb::test::
  tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::insert_internal((tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                     *)local_180,0xff0001,v_01,false);
  auStack_58 = (undefined1  [8])0x3;
  gtest_msg.value._M_dataplus._M_p = (pointer)0x2;
  gtest_msg.value._M_string_length = 0;
  gtest_msg.value.field_2._M_allocated_capacity = 0;
  gtest_msg.value.field_2._8_8_ = 0;
  unodb::test::
  tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::assert_node_counts
            ((tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
              *)local_180,(node_type_counter_array *)auStack_58);
  auStack_58 = (undefined1  [8])0x2;
  gtest_msg.value._M_dataplus._M_p = (pointer)0x0;
  gtest_msg.value._M_string_length = 0;
  gtest_msg.value.field_2._M_allocated_capacity = 0;
  unodb::test::
  tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::assert_growing_inodes
            ((tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
              *)local_180,(inode_type_counter_array *)auStack_58);
  unodb::test::
  tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::assert_key_prefix_splits
            ((tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
              *)local_180,1);
  gtest_msg.value.field_2._M_allocated_capacity = 0;
  auStack_58 = (undefined1  [8])&gtest_msg.value._M_string_length;
  gtest_msg.value._M_dataplus._M_p = (pointer)0x0;
  gtest_msg.value._M_string_length = 0;
  unodb::test::allocation_failure_injector::fail_on_nth_allocation_.
  super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)1;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    v_02._M_extent._M_extent_value = 2;
    v_02._M_ptr = (pointer)&unodb::test::test_value_2;
    unodb::test::
    tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
    ::insert_internal((tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                       *)local_180,0xff0101,v_02,false);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_58,0,
             (size_type)gtest_msg.value._M_dataplus._M_p,
             "Expected: test(verifier) throws an exception of type std::bad_alloc.\n  Actual: it throws nothing."
             ,0x61);
  this_00 = &verifier.key_views.
             super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  testing::Message::Message(local_78);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)this_00,kFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_oom.cpp"
             ,0x30,(char *)auStack_58);
  testing::internal::AssertHelper::operator=((AssertHelper *)this_00,local_78);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
  if (local_78[0].ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl !=
      (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_78[0].ss_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl + 8))();
  }
  if (auStack_58 != (undefined1  [8])&gtest_msg.value._M_string_length) {
    operator_delete((void *)auStack_58,gtest_msg.value._M_string_length + 1);
  }
  if (verifier._224_8_ != 0) {
    operator_delete((void *)verifier._224_8_,
                    (long)verifier.key_views.
                          super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - verifier._224_8_);
  }
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_unodb::test::tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>::comparator,_std::allocator<std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_unodb::test::tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>::comparator,_std::allocator<std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
               *)&verifier.test_db.mutex.super___mutex_base._M_mutex.__data.__list.__next);
  unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::~db
            ((db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *)&verifier);
  return;
}

Assistant:

UNODB_TYPED_TEST(ARTOOMTest, DbInsertNodeRecursion) {
  oom_insert_test<TypeParam>(
      3,
      [](unodb::test::tree_verifier<TypeParam>& verifier) {
        verifier.insert(1, unodb::test::test_values[0]);
        verifier.insert(3, unodb::test::test_values[2]);
        // Insert a value that does not share full prefix with the current Node4
        verifier.insert(0xFF0001, unodb::test::test_values[3]);
#ifdef UNODB_DETAIL_WITH_STATS
        verifier.assert_node_counts({3, 2, 0, 0, 0});
        verifier.assert_growing_inodes({2, 0, 0, 0});
        verifier.assert_key_prefix_splits(1);
#endif  // UNODB_DETAIL_WITH_STATS
      },
      // Then insert a value that shares full prefix with the above node and
      // will ask for a recursive insertion there
      0xFF0101, unodb::test::test_values[1],
      [](unodb::test::tree_verifier<TypeParam>&
#ifdef UNODB_DETAIL_WITH_STATS
             verifier
#endif  // UNODB_DETAIL_WITH_STATS
      ) {
#ifdef UNODB_DETAIL_WITH_STATS
        verifier.assert_node_counts({4, 3, 0, 0, 0});
        verifier.assert_growing_inodes({3, 0, 0, 0});
#endif  // UNODB_DETAIL_WITH_STATS
      });
}